

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

Token * __thiscall inja::Lexer::scan(Token *__return_storage_ptr__,Lexer *this)

{
  char **ppcVar1;
  ulong uVar2;
  size_type sVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  long lVar7;
  size_t in_R8;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  string_view sVar9;
  string_view text_00;
  bool must_rstrip;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  size_type local_208;
  size_t end;
  char *local_1f8;
  string_view local_1f0;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  string_view local_1d0;
  string_view local_1c0;
  string_view local_1b0;
  size_t local_1a0;
  size_t local_198;
  Lexer *local_190;
  char *local_188;
  string_view local_180;
  string_view *local_170;
  char *local_168;
  undefined1 local_160 [8];
  string_view text;
  bool local_49;
  bool must_lstrip;
  string_view open_str;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  size_type local_18;
  size_t open_start;
  Lexer *this_local;
  
  this->tok_start = this->pos;
  open_start = (size_t)this;
LAB_0019ad00:
  do {
    uVar2 = this->tok_start;
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in);
    if (sVar5 <= uVar2) {
      make_token(__return_storage_ptr__,this,Eof);
      return __return_storage_ptr__;
    }
    switch(this->state) {
    case ExpressionStart:
      this->state = ExpressionBody;
      lVar7 = ::std::__cxx11::string::size();
      this->pos = lVar7 + this->pos;
      make_token(__return_storage_ptr__,this,ExpressionOpen);
      return __return_storage_ptr__;
    case ExpressionStartForceLstrip:
      this->state = ExpressionBody;
      lVar7 = ::std::__cxx11::string::size();
      this->pos = lVar7 + this->pos;
      make_token(__return_storage_ptr__,this,ExpressionOpen);
      return __return_storage_ptr__;
    case ExpressionBody:
      local_1b0 = (string_view)
                  ::std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&this->config->expression_close);
      local_1c0 = (string_view)
                  ::std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&this->config->expression_close_force_rstrip);
      scan_body(__return_storage_ptr__,this,local_1b0,ExpressionClose,local_1c0,false);
      return __return_storage_ptr__;
    case LineStart:
      this->state = LineBody;
      lVar7 = ::std::__cxx11::string::size();
      this->pos = lVar7 + this->pos;
      make_token(__return_storage_ptr__,this,LineStatementOpen);
      return __return_storage_ptr__;
    case LineBody:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d0,"\n");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0);
      sVar9._M_str = local_1e0._M_str;
      sVar9._M_len = local_1e0._M_len;
      scan_body(__return_storage_ptr__,this,local_1d0,LineStatementClose,sVar9,false);
      return __return_storage_ptr__;
    case StatementStart:
      this->state = StatementBody;
      lVar7 = ::std::__cxx11::string::size();
      this->pos = lVar7 + this->pos;
      make_token(__return_storage_ptr__,this,StatementOpen);
      return __return_storage_ptr__;
    case StatementStartNoLstrip:
      this->state = StatementBody;
      lVar7 = ::std::__cxx11::string::size();
      this->pos = lVar7 + this->pos;
      make_token(__return_storage_ptr__,this,StatementOpen);
      return __return_storage_ptr__;
    case StatementStartForceLstrip:
      this->state = StatementBody;
      lVar7 = ::std::__cxx11::string::size();
      this->pos = lVar7 + this->pos;
      make_token(__return_storage_ptr__,this,StatementOpen);
      return __return_storage_ptr__;
    case StatementBody:
      local_1f0 = (string_view)
                  ::std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&this->config->statement_close);
      sVar9 = (string_view)
              ::std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->config->statement_close_force_rstrip);
      local_1f8 = sVar9._M_str;
      end = sVar9._M_len;
      scan_body(__return_storage_ptr__,this,local_1f0,StatementClose,sVar9,
                (bool)(this->config->trim_blocks & 1));
      return __return_storage_ptr__;
    case CommentStart:
      this->state = CommentBody;
      lVar7 = ::std::__cxx11::string::size();
      this->pos = lVar7 + this->pos;
      make_token(__return_storage_ptr__,this,CommentOpen);
      return __return_storage_ptr__;
    case CommentStartForceLstrip:
      this->state = CommentBody;
      lVar7 = ::std::__cxx11::string::size();
      this->pos = lVar7 + this->pos;
      make_token(__return_storage_ptr__,this,CommentOpen);
      return __return_storage_ptr__;
    case CommentBody:
      local_218 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            (&this->m_in,this->pos,0xffffffffffffffff);
      bVar8 = (basic_string_view<char,_std::char_traits<char>_>)
              ::std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->config->comment_close);
      local_208 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_218,bVar8,0);
      if (local_208 == 0xffffffffffffffff) {
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in);
        this->pos = sVar5;
        make_token(__return_storage_ptr__,this,Eof);
        return __return_storage_ptr__;
      }
      bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&this->m_in,(this->pos + local_208) - 1,0xffffffffffffffff);
      sVar9 = (string_view)
              ::std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->config->comment_close_force_rstrip);
      bVar4 = string_view::starts_with(bVar8,sVar9);
      sVar3 = local_208;
      this->state = Text;
      lVar7 = ::std::__cxx11::string::size();
      this->pos = sVar3 + lVar7 + this->pos;
      make_token(__return_storage_ptr__,this,CommentClose);
      if ((!bVar4) && ((this->config->trim_blocks & 1U) == 0)) {
        return __return_storage_ptr__;
      }
      skip_whitespaces_and_first_newline(this);
      return __return_storage_ptr__;
    }
    local_28 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&this->m_in,this->pos,0xffffffffffffffff);
    bVar8 = (basic_string_view<char,_std::char_traits<char>_>)
            ::std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&this->config->open_chars);
    local_18 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         (&local_28,bVar8,0);
    if (local_18 == 0xffffffffffffffff) {
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in);
      this->pos = sVar5;
      make_token(__return_storage_ptr__,this,Text);
      return __return_storage_ptr__;
    }
    this->pos = local_18 + this->pos;
    bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&this->m_in,this->pos,0xffffffffffffffff);
    local_49 = false;
    sVar9 = (string_view)
            ::std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&this->config->expression_open);
    bVar4 = string_view::starts_with(bVar8,sVar9);
    if (bVar4) {
      sVar9 = (string_view)
              ::std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->config->expression_open_force_lstrip);
      local_49 = string_view::starts_with(bVar8,sVar9);
      if (local_49) {
        this->state = ExpressionStartForceLstrip;
      }
      else {
        this->state = ExpressionStart;
      }
    }
    else {
      sVar9 = (string_view)
              ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)this->config);
      bVar4 = string_view::starts_with(bVar8,sVar9);
      if (bVar4) {
        sVar9 = (string_view)
                ::std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&this->config->statement_open_no_lstrip);
        bVar4 = string_view::starts_with(bVar8,sVar9);
        if (bVar4) {
          this->state = StatementStartNoLstrip;
        }
        else {
          sVar9 = (string_view)
                  ::std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&this->config->statement_open_force_lstrip);
          bVar4 = string_view::starts_with(bVar8,sVar9);
          if (bVar4) {
            this->state = StatementStartForceLstrip;
            local_49 = true;
          }
          else {
            this->state = StatementStart;
            local_49 = (bool)(this->config->lstrip_blocks & 1);
          }
        }
      }
      else {
        sVar9 = (string_view)
                ::std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&this->config->comment_open);
        bVar4 = string_view::starts_with(bVar8,sVar9);
        if (!bVar4) {
          if ((this->pos == 0) ||
             (pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 (&this->m_in,this->pos - 1), *pvVar6 == '\n')) {
            sVar9 = (string_view)
                    ::std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&this->config->line_statement);
            text._M_str = (char *)sVar9._M_len;
            bVar4 = string_view::starts_with(bVar8,sVar9);
            if (bVar4) {
              this->state = LineStart;
              goto LAB_0019b221;
            }
          }
          this->pos = this->pos + 1;
          goto LAB_0019ad00;
        }
        sVar9 = (string_view)
                ::std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&this->config->comment_open_force_lstrip);
        bVar4 = string_view::starts_with(bVar8,sVar9);
        if (bVar4) {
          this->state = CommentStartForceLstrip;
          local_49 = true;
        }
        else {
          this->state = CommentStart;
          local_49 = (bool)(this->config->lstrip_blocks & 1);
        }
      }
    }
LAB_0019b221:
    local_170 = (string_view *)(this->m_in)._M_len;
    ppcVar1 = &(this->m_in)._M_str;
    local_168 = *ppcVar1;
    _local_160 = string_view::slice(local_170,*(string_view *)ppcVar1,this->pos,in_R8);
    text_00._M_str = local_160._8_8_;
    if (local_49 != false) {
      local_190 = (Lexer *)local_160;
      text_00._M_len = (size_t)text_00._M_str;
      local_188 = text_00._M_str;
      local_180 = clear_final_line_if_whitespace((Lexer *)local_160,text_00);
      _local_160 = local_180;
    }
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_160);
    if (!bVar4) {
      local_1a0 = (size_t)local_160;
      local_198 = text._M_len;
      Token::Token(__return_storage_ptr__,Text,_local_160);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Token scan() {
    tok_start = pos;

  again:
    if (tok_start >= m_in.size()) {
      return make_token(Token::Kind::Eof);
    }

    switch (state) {
    default:
    case State::Text: {
      // fast-scan to first open character
      const size_t open_start = m_in.substr(pos).find_first_of(config.open_chars);
      if (open_start == std::string_view::npos) {
        // didn't find open, return remaining text as text token
        pos = m_in.size();
        return make_token(Token::Kind::Text);
      }
      pos += open_start;

      // try to match one of the opening sequences, and get the close
      const std::string_view open_str = m_in.substr(pos);
      bool must_lstrip = false;
      if (inja::string_view::starts_with(open_str, config.expression_open)) {
        if (inja::string_view::starts_with(open_str, config.expression_open_force_lstrip)) {
          state = State::ExpressionStartForceLstrip;
          must_lstrip = true;
        } else {
          state = State::ExpressionStart;
        }
      } else if (inja::string_view::starts_with(open_str, config.statement_open)) {
        if (inja::string_view::starts_with(open_str, config.statement_open_no_lstrip)) {
          state = State::StatementStartNoLstrip;
        } else if (inja::string_view::starts_with(open_str, config.statement_open_force_lstrip)) {
          state = State::StatementStartForceLstrip;
          must_lstrip = true;
        } else {
          state = State::StatementStart;
          must_lstrip = config.lstrip_blocks;
        }
      } else if (inja::string_view::starts_with(open_str, config.comment_open)) {
        if (inja::string_view::starts_with(open_str, config.comment_open_force_lstrip)) {
          state = State::CommentStartForceLstrip;
          must_lstrip = true;
        } else {
          state = State::CommentStart;
          must_lstrip = config.lstrip_blocks;
        }
      } else if ((pos == 0 || m_in[pos - 1] == '\n') && inja::string_view::starts_with(open_str, config.line_statement)) {
        state = State::LineStart;
      } else {
        pos += 1; // wasn't actually an opening sequence
        goto again;
      }

      std::string_view text = string_view::slice(m_in, tok_start, pos);
      if (must_lstrip) {
        text = clear_final_line_if_whitespace(text);
      }

      if (text.empty()) {
        goto again; // don't generate empty token
      }
      return Token(Token::Kind::Text, text);
    }
    case State::ExpressionStart: {
      state = State::ExpressionBody;
      pos += config.expression_open.size();
      return make_token(Token::Kind::ExpressionOpen);
    }
    case State::ExpressionStartForceLstrip: {
      state = State::ExpressionBody;
      pos += config.expression_open_force_lstrip.size();
      return make_token(Token::Kind::ExpressionOpen);
    }
    case State::LineStart: {
      state = State::LineBody;
      pos += config.line_statement.size();
      return make_token(Token::Kind::LineStatementOpen);
    }
    case State::StatementStart: {
      state = State::StatementBody;
      pos += config.statement_open.size();
      return make_token(Token::Kind::StatementOpen);
    }
    case State::StatementStartNoLstrip: {
      state = State::StatementBody;
      pos += config.statement_open_no_lstrip.size();
      return make_token(Token::Kind::StatementOpen);
    }
    case State::StatementStartForceLstrip: {
      state = State::StatementBody;
      pos += config.statement_open_force_lstrip.size();
      return make_token(Token::Kind::StatementOpen);
    }
    case State::CommentStart: {
      state = State::CommentBody;
      pos += config.comment_open.size();
      return make_token(Token::Kind::CommentOpen);
    }
    case State::CommentStartForceLstrip: {
      state = State::CommentBody;
      pos += config.comment_open_force_lstrip.size();
      return make_token(Token::Kind::CommentOpen);
    }
    case State::ExpressionBody:
      return scan_body(config.expression_close, Token::Kind::ExpressionClose, config.expression_close_force_rstrip);
    case State::LineBody:
      return scan_body("\n", Token::Kind::LineStatementClose);
    case State::StatementBody:
      return scan_body(config.statement_close, Token::Kind::StatementClose, config.statement_close_force_rstrip, config.trim_blocks);
    case State::CommentBody: {
      // fast-scan to comment close
      const size_t end = m_in.substr(pos).find(config.comment_close);
      if (end == std::string_view::npos) {
        pos = m_in.size();
        return make_token(Token::Kind::Eof);
      }

      // Check for trim pattern
      const bool must_rstrip = inja::string_view::starts_with(m_in.substr(pos + end - 1), config.comment_close_force_rstrip);

      // return the entire comment in the close token
      state = State::Text;
      pos += end + config.comment_close.size();
      Token tok = make_token(Token::Kind::CommentClose);

      if (must_rstrip || config.trim_blocks) {
        skip_whitespaces_and_first_newline();
      }
      return tok;
    }
    }
  }